

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpanel_bmod.c
# Opt level: O0

void dpanel_bmod(int m,int w,int jcol,int nseg,double *dense,double *tempv,int *segrep,int *repfnz,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int iVar1;
  int iVar2;
  int iVar3;
  flops_t *pfVar4;
  int *piVar5;
  int *piVar6;
  int_t *piVar7;
  int_t *piVar8;
  void *pvVar9;
  int_t *piVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int ldm;
  int nrow_00;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  double *pdVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int local_130;
  int local_12c;
  int local_128;
  flops_t *ops;
  int colblk;
  int rowblk;
  int maxsuper;
  int r_hi;
  int r_ind;
  int ldaTmp;
  double one;
  double zero;
  double *MatvecTmp;
  double *TriTmp;
  double *tempv1;
  double *dense_col;
  int *repfnz_col;
  int_t *xlusup;
  double *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int local_90;
  int jj;
  int i;
  int isub1;
  int isub;
  int no_zeros;
  int irow;
  int kfnz;
  int_t lptr;
  int block_nrow;
  int segsze;
  int_t luptr2;
  int_t luptr1;
  int_t luptr;
  double ukj2;
  double ukj1;
  double ukj;
  int krep_ind;
  int krep;
  int nrow;
  int nsupr;
  int nsupc;
  int fsupc;
  int ksub;
  int k;
  double *tempv_local;
  double *dense_local;
  int nseg_local;
  int jcol_local;
  int w_local;
  int m_local;
  
  pfVar4 = stat->ops;
  piVar5 = Glu->xsup;
  piVar6 = Glu->supno;
  piVar7 = Glu->lsub;
  piVar8 = Glu->xlsub;
  pvVar9 = Glu->lusup;
  piVar10 = Glu->xlusup;
  iVar11 = sp_ienv(3);
  iVar12 = sp_ienv(7);
  if (iVar12 < iVar11) {
    local_128 = sp_ienv(3);
  }
  else {
    local_128 = sp_ienv(7);
  }
  iVar11 = sp_ienv(4);
  iVar12 = sp_ienv(5);
  iVar13 = local_128 + iVar11;
  fsupc = nseg + -1;
  for (nsupc = 0; nsupc < nseg; nsupc = nsupc + 1) {
    iVar1 = segrep[fsupc];
    iVar2 = piVar5[piVar6[iVar1]];
    iVar14 = iVar1 - iVar2;
    iVar15 = iVar14 + 1;
    ldm = piVar8[iVar2 + 1] - piVar8[iVar2];
    nrow_00 = ldm - iVar15;
    iVar3 = piVar8[iVar2];
    iVar16 = iVar3 + iVar15;
    iVar17 = iVar16 + -1;
    dense_col = (double *)repfnz;
    tempv1 = dense;
    xsup._4_4_ = jcol;
    if ((iVar15 < iVar12) || (MatvecTmp = tempv, nrow_00 <= iVar11)) {
      for (; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        iVar19 = *(int *)((long)dense_col + (long)iVar1 * 4);
        if (iVar19 != -1) {
          iVar18 = (iVar1 - iVar19) + 1;
          iVar20 = piVar10[iVar2];
          pfVar4[0x13] = (float)(iVar18 * (iVar1 - iVar19)) + pfVar4[0x13];
          pfVar4[0x14] = (float)(nrow_00 * 2 * iVar18) + pfVar4[0x14];
          if (iVar18 == 1) {
            dVar23 = tempv1[piVar7[iVar17]];
            luptr2 = ldm * iVar14 + iVar15 + iVar20;
            for (local_90 = iVar3 + iVar15; local_90 < piVar8[iVar2 + 1]; local_90 = local_90 + 1) {
              tempv1[piVar7[local_90]] =
                   -dVar23 * *(double *)((long)pvVar9 + (long)luptr2 * 8) + tempv1[piVar7[local_90]]
              ;
              luptr2 = luptr2 + 1;
            }
          }
          else if (iVar18 < 4) {
            luptr2 = ldm * iVar14 + iVar15 + -1 + iVar20;
            dVar23 = tempv1[piVar7[iVar16 + -2]];
            segsze = luptr2 - ldm;
            if (iVar18 == 2) {
              dVar22 = -dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8) +
                       tempv1[piVar7[iVar17]];
              tempv1[piVar7[iVar17]] = dVar22;
              for (local_90 = iVar3 + iVar15; local_90 < piVar8[iVar2 + 1]; local_90 = local_90 + 1)
              {
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                tempv1[piVar7[local_90]] =
                     tempv1[piVar7[local_90]] -
                     (dVar22 * *(double *)((long)pvVar9 + (long)luptr2 * 8) +
                     dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8));
              }
            }
            else {
              dVar22 = tempv1[piVar7[iVar16 + -3]];
              block_nrow = segsze - ldm;
              dVar23 = -dVar22 * *(double *)((long)pvVar9 + (long)(block_nrow + -1) * 8) + dVar23;
              dVar24 = -dVar22 * *(double *)((long)pvVar9 + (long)block_nrow * 8) +
                       -dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8) +
                       tempv1[piVar7[iVar17]];
              tempv1[piVar7[iVar17]] = dVar24;
              tempv1[piVar7[iVar16 + -2]] = dVar23;
              for (local_90 = iVar3 + iVar15; local_90 < piVar8[iVar2 + 1]; local_90 = local_90 + 1)
              {
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                block_nrow = block_nrow + 1;
                tempv1[piVar7[local_90]] =
                     tempv1[piVar7[local_90]] -
                     (dVar22 * *(double *)((long)pvVar9 + (long)block_nrow * 8) +
                     dVar24 * *(double *)((long)pvVar9 + (long)luptr2 * 8) +
                     dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8));
              }
            }
          }
          else {
            iVar19 = iVar19 - iVar2;
            i = iVar3 + iVar19;
            for (local_90 = 0; local_90 < iVar18; local_90 = local_90 + 1) {
              tempv[local_90] = tempv1[piVar7[i]];
              i = i + 1;
            }
            iVar20 = ldm * iVar19 + iVar19 + iVar20;
            dlsolve(ldm,iVar18,(double *)((long)pvVar9 + (long)iVar20 * 8),tempv);
            pdVar21 = tempv + iVar18;
            dmatvec(ldm,nrow_00,iVar18,(double *)((long)pvVar9 + (long)(iVar18 + iVar20) * 8),tempv,
                    pdVar21);
            i = iVar3 + iVar19;
            for (local_90 = 0; local_90 < iVar18; local_90 = local_90 + 1) {
              tempv1[piVar7[i]] = tempv[local_90];
              tempv[local_90] = 0.0;
              i = i + 1;
            }
            for (local_90 = 0; local_90 < nrow_00; local_90 = local_90 + 1) {
              tempv1[piVar7[i]] = tempv1[piVar7[i]] - pdVar21[local_90];
              pdVar21[local_90] = 0.0;
              i = i + 1;
            }
          }
        }
        dense_col = (double *)((long)dense_col + (long)m * 4);
        tempv1 = tempv1 + m;
      }
    }
    else {
      for (; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        iVar19 = *(int *)((long)dense_col + (long)iVar1 * 4);
        if (iVar19 != -1) {
          iVar18 = (iVar1 - iVar19) + 1;
          iVar20 = piVar10[iVar2];
          pfVar4[0x13] = (float)(iVar18 * (iVar1 - iVar19)) + pfVar4[0x13];
          pfVar4[0x14] = (float)(nrow_00 * 2 * iVar18) + pfVar4[0x14];
          if (iVar18 == 1) {
            dVar23 = tempv1[piVar7[iVar17]];
            luptr2 = ldm * iVar14 + iVar15 + iVar20;
            for (local_90 = iVar3 + iVar15; local_90 < piVar8[iVar2 + 1]; local_90 = local_90 + 1) {
              tempv1[piVar7[local_90]] =
                   -dVar23 * *(double *)((long)pvVar9 + (long)luptr2 * 8) + tempv1[piVar7[local_90]]
              ;
              luptr2 = luptr2 + 1;
            }
          }
          else if (iVar18 < 4) {
            dVar23 = tempv1[piVar7[iVar16 + -2]];
            luptr2 = ldm * iVar14 + iVar15 + -1 + iVar20;
            segsze = luptr2 - ldm;
            if (iVar18 == 2) {
              dVar22 = -dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8) +
                       tempv1[piVar7[iVar17]];
              tempv1[piVar7[iVar17]] = dVar22;
              for (local_90 = iVar3 + iVar15; local_90 < piVar8[iVar2 + 1]; local_90 = local_90 + 1)
              {
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                tempv1[piVar7[local_90]] =
                     tempv1[piVar7[local_90]] -
                     (dVar22 * *(double *)((long)pvVar9 + (long)luptr2 * 8) +
                     dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8));
              }
            }
            else {
              dVar22 = tempv1[piVar7[iVar16 + -3]];
              block_nrow = segsze - ldm;
              dVar23 = -dVar22 * *(double *)((long)pvVar9 + (long)(block_nrow + -1) * 8) + dVar23;
              dVar24 = -dVar22 * *(double *)((long)pvVar9 + (long)block_nrow * 8) +
                       -dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8) +
                       tempv1[piVar7[iVar17]];
              tempv1[piVar7[iVar17]] = dVar24;
              tempv1[piVar7[iVar16 + -2]] = dVar23;
              for (local_90 = iVar3 + iVar15; local_90 < piVar8[iVar2 + 1]; local_90 = local_90 + 1)
              {
                luptr2 = luptr2 + 1;
                segsze = segsze + 1;
                block_nrow = block_nrow + 1;
                tempv1[piVar7[local_90]] =
                     tempv1[piVar7[local_90]] -
                     (dVar22 * *(double *)((long)pvVar9 + (long)block_nrow * 8) +
                     dVar24 * *(double *)((long)pvVar9 + (long)luptr2 * 8) +
                     dVar23 * *(double *)((long)pvVar9 + (long)segsze * 8));
              }
            }
          }
          else {
            iVar19 = iVar19 - iVar2;
            i = iVar3 + iVar19;
            for (local_90 = 0; local_90 < iVar18; local_90 = local_90 + 1) {
              MatvecTmp[local_90] = tempv1[piVar7[i]];
              i = i + 1;
            }
            dlsolve(ldm,iVar18,(double *)((long)pvVar9 + (long)(ldm * iVar19 + iVar19 + iVar20) * 8)
                    ,MatvecTmp);
          }
        }
        dense_col = (double *)((long)dense_col + (long)m * 4);
        tempv1 = tempv1 + m;
        MatvecTmp = MatvecTmp + iVar13;
      }
      for (maxsuper = 0; maxsuper < nrow_00; maxsuper = iVar11 + maxsuper) {
        local_12c = nrow_00;
        if (maxsuper + iVar11 <= nrow_00) {
          local_12c = maxsuper + iVar11;
        }
        local_130 = iVar11;
        if (local_12c - maxsuper <= iVar11) {
          local_130 = local_12c - maxsuper;
        }
        iVar14 = piVar10[iVar2];
        dense_col = (double *)repfnz;
        MatvecTmp = tempv;
        tempv1 = dense;
        for (xsup._4_4_ = jcol; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
          iVar16 = *(int *)((long)dense_col + (long)iVar1 * 4);
          if ((iVar16 != -1) && (iVar17 = (iVar1 - iVar16) + 1, 3 < iVar17)) {
            pdVar21 = MatvecTmp + local_128;
            dmatvec(ldm,local_130,iVar17,
                    (double *)
                    ((long)pvVar9 + (long)(iVar14 + iVar15 + maxsuper + ldm * (iVar16 - iVar2)) * 8)
                    ,MatvecTmp,pdVar21);
            i = iVar3 + iVar15 + maxsuper;
            for (local_90 = 0; local_90 < local_130; local_90 = local_90 + 1) {
              tempv1[piVar7[i]] = tempv1[piVar7[i]] - pdVar21[local_90];
              pdVar21[local_90] = 0.0;
              i = i + 1;
            }
          }
          dense_col = (double *)((long)dense_col + (long)m * 4);
          tempv1 = tempv1 + m;
          MatvecTmp = MatvecTmp + iVar13;
        }
      }
      dense_col = (double *)repfnz;
      MatvecTmp = tempv;
      tempv1 = dense;
      for (xsup._4_4_ = jcol; xsup._4_4_ < jcol + w; xsup._4_4_ = xsup._4_4_ + 1) {
        iVar14 = *(int *)((long)dense_col + (long)iVar1 * 4);
        if ((iVar14 != -1) && (iVar15 = (iVar1 - iVar14) + 1, 3 < iVar15)) {
          i = iVar3 + (iVar14 - iVar2);
          for (local_90 = 0; local_90 < iVar15; local_90 = local_90 + 1) {
            tempv1[piVar7[i]] = MatvecTmp[local_90];
            MatvecTmp[local_90] = 0.0;
            i = i + 1;
          }
        }
        dense_col = (double *)((long)dense_col + (long)m * 4);
        tempv1 = tempv1 + m;
        MatvecTmp = MatvecTmp + iVar13;
      }
    }
    fsupc = fsupc + -1;
  }
  return;
}

Assistant:

void
dpanel_bmod (
	    const int  m,          /* in - number of rows in the matrix */
	    const int  w,          /* in */
	    const int  jcol,       /* in */
	    const int  nseg,       /* in */
	    double     *dense,     /* out, of size n by w */
	    double     *tempv,     /* working array */
	    int        *segrep,    /* in */
	    int        *repfnz,    /* in, of size n by w */
	    GlobalLU_t *Glu,       /* modified */
	    SuperLUStat_t *stat    /* output */
	    )
{


#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int          incx = 1, incy = 1;
    double       alpha, beta;
#endif

    register int k, ksub;
    int          fsupc, nsupc, nsupr, nrow;
    int          krep, krep_ind;
    double       ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          segsze;
    int          block_nrow;  /* no of rows in a block row */
    int_t        lptr;	      /* Points to the row subscripts of a supernode */
    int          kfnz, irow, no_zeros; 
    register int isub, isub1, i;
    register int jj;	      /* Index through each column in the panel */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    int          *repfnz_col; /* repfnz[] for a column in the panel */
    double       *dense_col;  /* dense[] for a column in the panel */
    double       *tempv1;             /* Used in 1-D update */
    double       *TriTmp, *MatvecTmp; /* used in 2-D update */
    double      zero = 0.0;
    double      one = 1.0;
    register int ldaTmp;
    register int r_ind, r_hi;
    int  maxsuper, rowblk, colblk;
    flops_t  *ops = stat->ops;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;
    
    maxsuper = SUPERLU_MAX( sp_ienv(3), sp_ienv(7) );
    rowblk   = sp_ienv(4);
    colblk   = sp_ienv(5);
    ldaTmp   = maxsuper + rowblk;

    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) { /* for each updating supernode */

	/* krep = representative of current k-th supernode
	 * fsupc = first supernodal column
	 * nsupc = no of columns in a supernode
	 * nsupr = no of rows in a supernode
	 */
        krep = segrep[k--];
	fsupc = xsup[supno[krep]];
	nsupc = krep - fsupc + 1;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];
	nrow = nsupr - nsupc;
	lptr = xlsub[fsupc];
	krep_ind = lptr + nsupc - 1;

	repfnz_col = repfnz;
	dense_col = dense;
	
	if ( nsupc >= colblk && nrow > rowblk ) { /* 2-D block update */

	    TriTmp = tempv;
	
	    /* Sequence through each column in panel -- triangular solves */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp ) {

		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
	    
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += segsze * (segsze - 1);
		ops[GEMV] += 2 * nrow * segsze;
	
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
			dense_col[irow] -= ukj * lusup[luptr];
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
			ukj -= ukj1 * lusup[luptr1];
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++;
			    dense_col[irow] -= (ukj*lusup[luptr]
						+ ukj1*lusup[luptr1]);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
			ukj1 -= ukj2 * lusup[luptr2-1];
			ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    luptr++; luptr1++; luptr2++;
			    dense_col[irow] -= ( ukj*lusup[luptr]
                             + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
			}
		    }

		} else  {	/* segsze >= 4 */
		    
		    /* Copy U[*,j] segment from dense[*] to TriTmp[*], which
		       holds the result of triangular solves.    */
		    no_zeros = kfnz - fsupc;
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			TriTmp[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;

#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#else
		    dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, TriTmp, &incx );
#endif
#else		
		    dlsolve ( nsupr, segsze, &lusup[luptr], TriTmp );
#endif
		    

		} /* else ... */
	    
	    }  /* for jj ... end tri-solves */

	    /* Block row updates; push all the way into dense[*] block */
	    for ( r_ind = 0; r_ind < nrow; r_ind += rowblk ) {
		
		r_hi = SUPERLU_MIN(nrow, r_ind + rowblk);
		block_nrow = SUPERLU_MIN(rowblk, r_hi - r_ind);
		luptr = xlusup[fsupc] + nsupc + r_ind;
		isub1 = lptr + nsupc + r_ind;
		
		repfnz_col = repfnz;
		TriTmp = tempv;
		dense_col = dense;
		
		/* Sequence through each column in panel -- matrix-vector */
		for (jj = jcol; jj < jcol + w; jj++,
		     repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		    
		    kfnz = repfnz_col[krep];
		    if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		    
		    segsze = krep - kfnz + 1;
		    if ( segsze <= 3 ) continue;   /* skip unrolled cases */
		    
		    /* Perform a block update, and scatter the result of
		       matrix-vector to dense[].		 */
		    no_zeros = kfnz - fsupc;
		    luptr1 = luptr + nsupr * no_zeros;
		    MatvecTmp = &TriTmp[maxsuper];
		    
#ifdef USE_VENDOR_BLAS
		    alpha = one; 
                    beta = zero;
#ifdef _CRAY
		    SGEMV(ftcs2, &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#else
		    dgemv_("N", &block_nrow, &segsze, &alpha, &lusup[luptr1], 
			   &nsupr, TriTmp, &incx, &beta, MatvecTmp, &incy);
#endif
#else
		    dmatvec(nsupr, block_nrow, segsze, &lusup[luptr1],
			   TriTmp, MatvecTmp);
#endif
		    
		    /* Scatter MatvecTmp[*] into SPA dense[*] temporarily
		     * such that MatvecTmp[*] can be re-used for the
		     * the next blok row update. dense[] will be copied into 
		     * global store after the whole panel has been finished.
		     */
		    isub = isub1;
		    for (i = 0; i < block_nrow; i++) {
			irow = lsub[isub];
			dense_col[irow] -= MatvecTmp[i];
			MatvecTmp[i] = zero;
			++isub;
		    }
		    
		} /* for jj ... */
		
	    } /* for each block row ... */
	    
	    /* Scatter the triangular solves into SPA dense[*] */
	    repfnz_col = repfnz;
	    TriTmp = tempv;
	    dense_col = dense;
	    
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m, TriTmp += ldaTmp) {
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue; /* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		if ( segsze <= 3 ) continue; /* skip unrolled cases */
		
		no_zeros = kfnz - fsupc;		
		isub = lptr + no_zeros;
		for (i = 0; i < segsze; i++) {
		    irow = lsub[isub];
		    dense_col[irow] = TriTmp[i];
		    TriTmp[i] = zero;
		    ++isub;
		}
		
	    } /* for jj ... */
	    
	} else { /* 1-D block modification */
	    
	    
	    /* Sequence through each column in the panel */
	    for (jj = jcol; jj < jcol + w; jj++,
		 repfnz_col += m, dense_col += m) {
		
		kfnz = repfnz_col[krep];
		if ( kfnz == SLU_EMPTY ) continue;	/* Skip any zero segment */
		
		segsze = krep - kfnz + 1;
		luptr = xlusup[fsupc];

		ops[TRSV] += segsze * (segsze - 1);
		ops[GEMV] += 2 * nrow * segsze;
		
		/* Case 1: Update U-segment of size 1 -- col-col update */
		if ( segsze == 1 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc;

		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; i++) {
			irow = lsub[i];
			dense_col[irow] -= ukj * lusup[luptr];
			++luptr;
		    }

		} else if ( segsze <= 3 ) {
		    ukj = dense_col[lsub[krep_ind]];
		    luptr += nsupr*(nsupc-1) + nsupc-1;
		    ukj1 = dense_col[lsub[krep_ind - 1]];
		    luptr1 = luptr - nsupr;

		    if ( segsze == 2 ) {
			ukj -= ukj1 * lusup[luptr1];
			dense_col[lsub[krep_ind]] = ukj;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr;  ++luptr1;
			    dense_col[irow] -= (ukj*lusup[luptr]
						+ ukj1*lusup[luptr1]);
			}
		    } else {
			ukj2 = dense_col[lsub[krep_ind - 2]];
			luptr2 = luptr1 - nsupr;
			ukj1 -= ukj2 * lusup[luptr2-1];
			ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
			dense_col[lsub[krep_ind]] = ukj;
			dense_col[lsub[krep_ind-1]] = ukj1;
			for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
			    irow = lsub[i];
			    ++luptr; ++luptr1; ++luptr2;
			    dense_col[irow] -= ( ukj*lusup[luptr]
                             + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
			}
		    }

		} else  { /* segsze >= 4 */
		    /* 
		     * Perform a triangular solve and block update,
		     * then scatter the result of sup-col update to dense[].
		     */
		    no_zeros = kfnz - fsupc;
		    
		    /* Copy U[*,j] segment from dense[*] to tempv[*]: 
		     *    The result of triangular solve is in tempv[*];
		     *    The result of matrix vector update is in dense_col[*]
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; ++i) {
			irow = lsub[isub];
			tempv[i] = dense_col[irow]; /* Gather */
			++isub;
		    }
		    
		    /* start effective triangle */
		    luptr += nsupr * no_zeros + no_zeros;
		    
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#else
		    dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
			   &nsupr, tempv, &incx );
#endif
		    
		    luptr += segsze;	/* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
                    alpha = one;
                    beta = zero;
#ifdef _CRAY
		    SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		    dgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
			   &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		    dlsolve ( nsupr, segsze, &lusup[luptr], tempv );
		    
		    luptr += segsze;        /* Dense matrix-vector */
		    tempv1 = &tempv[segsze];
		    dmatvec (nsupr, nrow, segsze, &lusup[luptr], tempv, tempv1);
#endif
		    
		    /* Scatter tempv[*] into SPA dense[*] temporarily, such
		     * that tempv[*] can be used for the triangular solve of
		     * the next column of the panel. They will be copied into 
		     * ucol[*] after the whole panel has been finished.
		     */
		    isub = lptr + no_zeros;
		    for (i = 0; i < segsze; i++) {
			irow = lsub[isub];
			dense_col[irow] = tempv[i];
			tempv[i] = zero;
			isub++;
		    }
		    
		    /* Scatter the update from tempv1[*] into SPA dense[*] */
		    /* Start dense rectangular L */
		    for (i = 0; i < nrow; i++) {
			irow = lsub[isub];
			dense_col[irow] -= tempv1[i];
			tempv1[i] = zero;
			++isub;	
		    }
		    
		} /* else segsze>=4 ... */
		
	    } /* for each column in the panel... */
	    
	} /* else 1-D update ... */

    } /* for each updating supernode ... */

}